

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ResultBuilder::ResultBuilder
          (ResultBuilder *this,char *macroName,SourceLineInfo *lineInfo,char *capturedExpression,
          Flags resultDisposition,char *secondArg)

{
  string *in_RCX;
  undefined8 in_RDX;
  string *in_RSI;
  AssertionInfo *in_RDI;
  char *in_R9;
  AssertionResultData *in_stack_fffffffffffffed0;
  Flags _resultDisposition;
  SourceLineInfo *_lineInfo;
  AssertionInfo *this_00;
  allocator local_d1;
  string local_d0 [39];
  undefined1 local_a9 [33];
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  char *local_30;
  string *local_20;
  Flags FStack_14;
  
  FStack_14 = (Flags)((ulong)in_RDX >> 0x20);
  this_00 = in_RDI;
  local_30 = in_R9;
  local_20 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,(char *)in_RSI,&local_51);
  _lineInfo = (SourceLineInfo *)local_a9;
  _resultDisposition = FStack_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_a9 + 1),(char *)local_20,(allocator *)_lineInfo);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,local_30,&local_d1);
  capturedExpressionWithSecondArgument(in_RSI,&this_00->macroName);
  AssertionInfo::AssertionInfo(this_00,&in_RDI->macroName,_lineInfo,local_20,_resultDisposition);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string((string *)(local_a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_a9);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  AssertionResultData::AssertionResultData(in_stack_fffffffffffffed0);
  ExprComponents::ExprComponents((ExprComponents *)&this_00[1].capturedExpression);
  CopyableStream::CopyableStream((CopyableStream *)0x18d5d0);
  *(undefined1 *)&this_00[5].resultDisposition = 0;
  *(byte *)((long)&this_00[5].resultDisposition + 1) = 0;
  return;
}

Assistant:

ResultBuilder::ResultBuilder(   char const* macroName,
                                    SourceLineInfo const& lineInfo,
                                    char const* capturedExpression,
                                    ResultDisposition::Flags resultDisposition,
                                    char const* secondArg )
    :   m_assertionInfo( macroName, lineInfo, capturedExpressionWithSecondArgument( capturedExpression, secondArg ), resultDisposition ),
        m_shouldDebugBreak( false ),
        m_shouldThrow( false )
    {}